

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

void __thiscall cplus::socket::Socket::Socket(Socket *this,String *host,uint16_t port)

{
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_toString_00124c10;
  this->socket = 0;
  (this->addr).sin_family = 0;
  (this->addr).sin_port = 0;
  (this->addr).sin_addr = 0;
  (this->addr).sin_zero[0] = '\0';
  (this->addr).sin_zero[1] = '\0';
  (this->addr).sin_zero[2] = '\0';
  (this->addr).sin_zero[3] = '\0';
  *(undefined8 *)((this->addr).sin_zero + 4) = 0;
  (this->local_addr).sin_addr = 0;
  (this->local_addr).sin_zero[0] = '\0';
  (this->local_addr).sin_zero[1] = '\0';
  (this->local_addr).sin_zero[2] = '\0';
  (this->local_addr).sin_zero[3] = '\0';
  (this->local_addr).sin_zero[4] = '\0';
  (this->local_addr).sin_zero[5] = '\0';
  (this->local_addr).sin_zero[6] = '\0';
  (this->local_addr).sin_zero[7] = '\0';
  lang::String::String(&this->address,host);
  lang::ByteArray::ByteArray(&this->buffer,0);
  (this->local_addr).sin_zero[0] = '\0';
  (this->local_addr).sin_zero[1] = '\0';
  (this->local_addr).sin_zero[2] = '\0';
  (this->local_addr).sin_zero[3] = '\0';
  (this->local_addr).sin_zero[4] = '\0';
  (this->local_addr).sin_zero[5] = '\0';
  (this->local_addr).sin_zero[6] = '\0';
  (this->local_addr).sin_zero[7] = '\0';
  (this->local_addr).sin_addr.s_addr = 0;
  *(undefined8 *)((this->addr).sin_zero + 4) = 0x200000000;
  (this->addr).sin_addr = 0;
  (this->addr).sin_zero[0] = '\0';
  (this->addr).sin_zero[1] = '\0';
  (this->addr).sin_zero[2] = '\0';
  (this->addr).sin_zero[3] = '\0';
  (this->addr).sin_family = 2;
  (this->addr).sin_port = port << 8 | port >> 8;
  return;
}

Assistant:

Socket::Socket(const lang::String &host, uint16_t port) : address(host), buffer(0) {
			bzero(&local_addr, sizeof(local_addr)); //把一段内存区的内容全部设置为0
			local_addr.sin_family = AF_INET;    //internet协议族
			local_addr.sin_addr.s_addr = htons(INADDR_ANY);//INADDR_ANY表示自动获取本机地址
			local_addr.sin_port = htons(0);    //0表示让系统自动分配一个空闲端口
			
			// 设置一个socket地址结构addr,代表服务器的internet地址, 端口
			bzero(&addr, sizeof(addr));
			addr.sin_family = AF_INET;
			addr.sin_port = htons(port);
		}